

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O3

void av1_accumulate_pack_bs_thread_data(AV1_COMP *cpi,ThreadData_conflict *td)

{
  int *piVar1;
  int iVar2;
  RefCntBuffer *pRVar3;
  int iVar4;
  InterpFilter filter;
  long lVar5;
  
  piVar1 = &(cpi->rc).coefficient_size;
  *piVar1 = *piVar1 + td->coefficient_size;
  if (((cpi->sf).mv_sf.auto_mv_step_size != 0) && (cpi->do_frame_data_update != false)) {
    iVar2 = (cpi->mv_search_params).max_mv_magnitude;
    iVar4 = td->max_mv_magnitude;
    if (td->max_mv_magnitude < iVar2) {
      iVar4 = iVar2;
    }
    (cpi->mv_search_params).max_mv_magnitude = iVar4;
  }
  pRVar3 = (cpi->common).cur_frame;
  lVar5 = 0;
  do {
    piVar1 = pRVar3->interp_filter_selected + lVar5;
    *piVar1 = *piVar1 + td->interp_filter_selected[lVar5];
    lVar5 = lVar5 + 1;
  } while (lVar5 != 4);
  return;
}

Assistant:

void av1_accumulate_pack_bs_thread_data(AV1_COMP *const cpi,
                                        ThreadData const *td) {
  int do_max_mv_magnitude_update = 1;
  cpi->rc.coefficient_size += td->coefficient_size;

  // Disable max_mv_magnitude update for parallel frames based on update flag.
  if (!cpi->do_frame_data_update) do_max_mv_magnitude_update = 0;

  if (cpi->sf.mv_sf.auto_mv_step_size && do_max_mv_magnitude_update)
    cpi->mv_search_params.max_mv_magnitude =
        AOMMAX(cpi->mv_search_params.max_mv_magnitude, td->max_mv_magnitude);

  for (InterpFilter filter = EIGHTTAP_REGULAR; filter < SWITCHABLE; filter++)
    cpi->common.cur_frame->interp_filter_selected[filter] +=
        td->interp_filter_selected[filter];
}